

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

void duckdb::string_util_internal::ConsumeLetter(string *str,idx_t *index,char expected)

{
  ulong uVar1;
  ParserException *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  uVar1 = *index;
  if ((uVar1 < str->_M_string_length) && ((str->_M_dataplus)._M_p[uVar1] == expected)) {
    *index = uVar1 + 1;
    return;
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Invalid quoted list: %s",&local_59);
  ::std::__cxx11::string::string((string *)&local_58,(string *)str);
  ParserException::ParserException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline void ConsumeLetter(const string &str, idx_t &index, char expected) {
	if (index >= str.size() || str[index] != expected) {
		throw ParserException("Invalid quoted list: %s", str);
	}

	index++;
}